

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::LargeHeapBucket::ExplicitFree(LargeHeapBucket *this,void *object,size_t sizeCat)

{
  code *pcVar1;
  bool bVar2;
  uchar uVar3;
  byte bVar4;
  LargeObjectHeader *in_RAX;
  undefined4 *puVar5;
  LargeObjectHeader *this_00;
  Recycler *pRVar6;
  LargeHeapBlock *pLVar7;
  ResetMarkFlags flags;
  void *pvVar8;
  LargeHeapBucket *this_01;
  LargeObjectHeader *local_38;
  LargeObjectHeader *dbgHeader;
  
  local_38 = in_RAX;
  if ((sizeCat + 0xff & 0xffffffffffffff00) != (ulong)(this->super_HeapBucket).sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1d7,
                       "(HeapInfo::GetMediumObjectAlignedSizeNoCheck(sizeCat) == this->sizeCat)",
                       "HeapInfo::GetMediumObjectAlignedSizeNoCheck(sizeCat) == this->sizeCat");
    if (!bVar2) goto LAB_006ef0a5;
    *puVar5 = 0;
  }
  this_00 = LargeHeapBlock::GetHeaderFromAddress(object);
  flags = ((this->super_HeapBucket).heapInfo)->recycler->Cookie;
  uVar3 = LargeObjectHeader::GetAttributes(this_00,flags);
  if (uVar3 != '\0') {
    flags = ((this->super_HeapBucket).heapInfo)->recycler->Cookie;
    uVar3 = LargeObjectHeader::GetAttributes(this_00,flags);
    if (uVar3 != ' ') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      flags = 0x1d9;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x1d9,
                         "(header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::NoBit || header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::LeafBit)"
                         ,
                         "header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::NoBit || header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::LeafBit"
                        );
      if (!bVar2) goto LAB_006ef0a5;
      *puVar5 = 0;
    }
  }
  bVar4 = this_00->field_0x1a;
  if ((bVar4 & 8) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    flags = 0x1da;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1da,"(!header->isExplicitFreed)","!header->isExplicitFreed");
    if (!bVar2) goto LAB_006ef0a5;
    *puVar5 = 0;
    bVar4 = this_00->field_0x1a;
  }
  this_00->field_0x1a = bVar4 | 8;
  if (this_00->objectSize < sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    flags = 0x1dc;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1dc,"(header->objectSize >= sizeCat)","header->objectSize >= sizeCat");
    if (!bVar2) goto LAB_006ef0a5;
    *puVar5 = 0;
  }
  this_01 = this;
  pRVar6 = HeapBucket::GetRecycler(&this->super_HeapBucket);
  if ((object < (void *)0x10000) || (((ulong)object & 0xf) != 0)) {
LAB_006ef0a7:
    ExplicitFree();
    pRVar6 = ((this_01->super_HeapBucket).heapInfo)->recycler;
    for (pLVar7 = this_01->largeBlockList; pLVar7 != (LargeHeapBlock *)0x0; pLVar7 = pLVar7->next) {
      LargeHeapBlock::ResetMarks(pLVar7,flags,pRVar6);
    }
    for (pLVar7 = this_01->largePageHeapBlockList; pLVar7 != (LargeHeapBlock *)0x0;
        pLVar7 = pLVar7->next) {
      LargeHeapBlock::ResetMarks(pLVar7,flags,pRVar6);
    }
    for (pLVar7 = this_01->fullLargeBlockList; pLVar7 != (LargeHeapBlock *)0x0;
        pLVar7 = pLVar7->next) {
      LargeHeapBlock::ResetMarks(pLVar7,flags,pRVar6);
    }
    for (pLVar7 = this_01->pendingDisposeLargeBlockList; pLVar7 != (LargeHeapBlock *)0x0;
        pLVar7 = pLVar7->next) {
      LargeHeapBlock::ResetMarks(pLVar7,flags,pRVar6);
    }
    if (((WeakReferenceHashTable<PrimePolicy> *)&this_01->pendingSweepLargeBlockList)->allocator !=
        (HeapAllocator *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x20c,"(pendingSweepLargeBlockList == nullptr)",
                         "pendingSweepLargeBlockList == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    return;
  }
  this_01 = (LargeHeapBucket *)&pRVar6->heapBlockMap;
  pvVar8 = object;
  pLVar7 = (LargeHeapBlock *)HeapBlockMap64::GetHeapBlock((HeapBlockMap64 *)this_01,object);
  flags = (ResetMarkFlags)pvVar8;
  if (pLVar7 == (LargeHeapBlock *)0x0) goto LAB_006ef0a7;
  if ((pLVar7->super_HeapBlock).heapBlockType != LargeBlockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1e1,"(heapBlock->IsLargeHeapBlock())","heapBlock->IsLargeHeapBlock()");
    if (!bVar2) goto LAB_006ef0a5;
    *puVar5 = 0;
  }
  bVar2 = LargeHeapBlock::GetObjectHeader(pLVar7,object,&local_38);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1e5,"(largeHeapBlock->GetObjectHeader(object, &dbgHeader))",
                       "largeHeapBlock->GetObjectHeader(object, &dbgHeader)");
    if (!bVar2) goto LAB_006ef0a5;
    *puVar5 = 0;
  }
  if (local_38 != this_00) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1e6,"(dbgHeader == header)","dbgHeader == header");
    if (!bVar2) {
LAB_006ef0a5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  FreeObject::SetNext((FreeObject *)object,this->explicitFreeList);
  this->explicitFreeList = (FreeObject *)object;
  LargeObjectHeader::SetAttributes
            (this_00,((this->super_HeapBucket).heapInfo)->recycler->Cookie,' ');
  return;
}

Assistant:

void
LargeHeapBucket::ExplicitFree(void * object, size_t sizeCat)
{
    Assert(HeapInfo::GetMediumObjectAlignedSizeNoCheck(sizeCat) == this->sizeCat);
    LargeObjectHeader * header = LargeHeapBlock::GetHeaderFromAddress(object);
    Assert(header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::NoBit || header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::LeafBit);
    Assert(!header->isExplicitFreed);
    DebugOnly(header->isExplicitFreed = true);
    Assert(header->objectSize >= sizeCat);

#if DBG
    HeapBlock* heapBlock = this->GetRecycler()->FindHeapBlock(object);
    Assert(heapBlock != nullptr);
    Assert(heapBlock->IsLargeHeapBlock());

    LargeHeapBlock * largeHeapBlock = (LargeHeapBlock *)heapBlock;
    LargeObjectHeader * dbgHeader;
    Assert(largeHeapBlock->GetObjectHeader(object, &dbgHeader));
    Assert(dbgHeader == header);
#endif

    FreeObject * freeObject = (FreeObject *)object;
    freeObject->SetNext(this->explicitFreeList);
    this->explicitFreeList = freeObject;
    header->SetAttributes(this->heapInfo->recycler->Cookie, ObjectInfoBits::LeafBit);       // We can stop scanning it now.


}